

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cc
# Opt level: O2

void __thiscall
helix::event::event(event *this,event_mask mask,string *symbol,uint64_t timestamp,order_book *ob,
                   trade *t)

{
  this->_mask = mask;
  std::__cxx11::string::string((string *)&this->_symbol,(string *)symbol);
  this->_timestamp = timestamp;
  this->_ob = ob;
  this->_trade = t;
  return;
}

Assistant:

event::event(event_mask mask, const std::string& symbol, uint64_t timestamp, order_book* ob, trade* t)
    : _mask{mask}
    , _symbol{symbol}
    , _timestamp{timestamp}
    , _ob{ob}
    , _trade{t}
{
}